

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O0

Read<int> __thiscall
Omega_h::Dist::exch_reduce<int>(Dist *this,Read<int> *data,Int width,Omega_h_Op op)

{
  undefined4 in_register_00000014;
  void *extraout_RDX;
  Omega_h_Op in_R8D;
  Read<int> RVar1;
  Read<int> local_78;
  Read<int> local_68 [2];
  Read<int> local_48;
  undefined1 local_38 [8];
  Read<int> item_data;
  Omega_h_Op op_local;
  Int width_local;
  Read<int> *data_local;
  Dist *this_local;
  
  item_data.write_.shared_alloc_.direct_ptr._0_4_ = in_R8D;
  item_data.write_.shared_alloc_.direct_ptr._4_4_ = op;
  Read<int>::Read(&local_48,(Read<int> *)CONCAT44(in_register_00000014,width));
  exch<int>((Dist *)local_38,data,(Int)&local_48);
  Read<int>::~Read(&local_48);
  Read<int>::Read(local_68,data + 2);
  Read<int>::Read(&local_78,(Read<int> *)local_38);
  fan_reduce<int>((Omega_h *)this,local_68,&local_78,item_data.write_.shared_alloc_.direct_ptr._4_4_
                  ,(Omega_h_Op)item_data.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_78);
  Read<int>::~Read(local_68);
  Read<int>::~Read((Read<int> *)local_38);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> Dist::exch_reduce(Read<T> data, Int width, Omega_h_Op op) const {
  Read<T> item_data = exch(data, width);
  return fan_reduce(roots2items_[R], item_data, width, op);
}